

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeGenericAlias * __thiscall
ExpressionContext::GetGenericAliasType(ExpressionContext *this,SynIdentifier *baseName)

{
  bool bVar1;
  ExpressionContext *this_00;
  ExpressionContext *local_60;
  char *local_58;
  char *local_50;
  InplaceStr local_48;
  ExpressionContext *local_38;
  TypeGenericAlias *result;
  TypeGenericAlias *type;
  uint e;
  uint i;
  SynIdentifier *baseName_local;
  ExpressionContext *this_local;
  
  type._4_4_ = 0;
  type._0_4_ = (this->genericAliasTypes).count;
  _e = baseName;
  baseName_local = (SynIdentifier *)this;
  while( true ) {
    if ((uint)type <= type._4_4_) {
      this_00 = (ExpressionContext *)get<TypeGenericAlias>(this);
      local_58 = (_e->name).begin;
      local_50 = (_e->name).end;
      local_48 = GetGenericAliasTypeName(this,_e->name);
      TypeGenericAlias::TypeGenericAlias((TypeGenericAlias *)this_00,local_48,_e);
      local_38 = this_00;
      SmallArray<TypeGenericAlias_*,_128U>::push_back
                (&this->genericAliasTypes,(TypeGenericAlias **)&local_38);
      local_60 = local_38;
      SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_60);
      return (TypeGenericAlias *)local_38;
    }
    result = (this->genericAliasTypes).data[type._4_4_];
    if ((result != (TypeGenericAlias *)0x0) &&
       (bVar1 = InplaceStr::operator==(&result->baseName->name,&_e->name), bVar1)) break;
    type._4_4_ = type._4_4_ + 1;
  }
  return result;
}

Assistant:

TypeGenericAlias* ExpressionContext::GetGenericAliasType(SynIdentifier *baseName)
{
	for(unsigned i = 0, e = genericAliasTypes.count; i < e; i++)
	{
		if(TypeGenericAlias *type = genericAliasTypes.data[i])
		{
			if(type->baseName->name == baseName->name)
				return type;
		}
	}

	// Create new type
	TypeGenericAlias* result = new (get<TypeGenericAlias>()) TypeGenericAlias(GetGenericAliasTypeName(*this, baseName->name), baseName);

	genericAliasTypes.push_back(result);
	types.push_back(result);

	return result;
}